

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t helper_testblock(CPUS390XState_conflict *env,uint64_t real_addr)

{
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  undefined4 local_24;
  int i;
  uintptr_t ra;
  uint64_t real_addr_local;
  CPUS390XState_conflict *env_local;
  
  uVar1 = wrap_address(env,real_addr);
  for (local_24 = 0; local_24 < 0x1000; local_24 = local_24 + 8) {
    cpu_stq_mmuidx_ra_s390x(env,(uVar1 & 0xfffffffffffff000) + (long)local_24,0,3,unaff_retaddr);
  }
  return 0;
}

Assistant:

uint32_t HELPER(testblock)(CPUS390XState *env, uint64_t real_addr)
{
    uintptr_t ra = GETPC();
    int i;

    real_addr = wrap_address(env, real_addr) & TARGET_PAGE_MASK;

    for (i = 0; i < TARGET_PAGE_SIZE; i += 8) {
        cpu_stq_mmuidx_ra(env, real_addr + i, 0, MMU_REAL_IDX, ra);
    }

    return 0;
}